

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_innerproduct.cpp
# Opt level: O1

int test_innerproduct(Mat *a,int outch,int bias)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  int iVar3;
  pointer pMVar4;
  uint_fast16_t uVar5;
  int iVar6;
  uint_fast16_t uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint i;
  ulong uVar11;
  bool bVar12;
  float fVar13;
  Option opt;
  void *ptr_1;
  Mat local_988;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights;
  ParamDict pd;
  
  ncnn::ParamDict::ParamDict(&pd);
  ncnn::ParamDict::set(&pd,0,outch);
  ncnn::ParamDict::set(&pd,1,1);
  ncnn::ParamDict::set(&pd,2,a->w * outch * a->h * a->c);
  uVar5 = g_prng_rand_state.c;
  bVar12 = g_prng_rand_state.c != 0;
  uVar7 = g_prng_rand_state.c - 1;
  g_prng_rand_state.c = 0x36;
  if (bVar12) {
    g_prng_rand_state.c = uVar7;
  }
  uVar9 = 0;
  do {
    iVar6 = (int)g_prng_rand_state.i;
    iVar3 = (int)uVar9;
    uVar11 = g_prng_rand_state.s[iVar6 + iVar3 + 9U & 0x3f] +
             g_prng_rand_state.s[iVar6 + iVar3 + 0x28U & 0x3f];
    uVar10 = uVar9 + 1;
    g_prng_rand_state.s[iVar6 + iVar3 & 0x3f] = uVar11;
    if (uVar5 != 0) break;
    bVar12 = uVar9 < 0x1ef;
    uVar9 = uVar10;
  } while (bVar12);
  g_prng_rand_state.i = g_prng_rand_state.i + uVar10;
  local_988.data = (void *)0x0;
  local_988.refcount._0_4_ = 0;
  local_988.refcount._4_4_ = 0;
  local_988.elemsize._0_4_ = 4;
  local_988.elemsize._4_4_ = 0;
  local_988.elempack = 1;
  local_988.allocator = (Allocator *)0x0;
  local_988.dims = 1;
  local_988.w = 2;
  local_988.h = 1;
  local_988.c = 1;
  local_988.cstep = 2;
  opt.lightmode = false;
  opt._1_3_ = 0;
  opt.num_threads = 0;
  iVar6 = posix_memalign((void **)&opt,0x10,0xc);
  if (iVar6 != 0) {
    opt.lightmode = false;
    opt._1_3_ = 0;
    opt.num_threads = 0;
  }
  local_988.refcount = (int *)(opt._0_8_ + 8);
  *(undefined4 *)(opt._0_8_ + 8) = 1;
  local_988.data = (void *)opt._0_8_;
  i = (int)uVar11 + (int)(uVar11 / 5) * -5;
  fVar13 = RandomFloat(-1.0,0.0);
  *(float *)local_988.data = fVar13;
  fVar13 = RandomFloat(0.0,1.0);
  *(float *)((long)local_988.data + 4) = fVar13;
  ncnn::ParamDict::set(&pd,9,i);
  ncnn::ParamDict::set(&pd,10,&local_988);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&weights,2,(allocator_type *)&opt);
  uVar9 = (ulong)outch;
  uVar10 = (long)a->c * (long)a->h * (long)a->w * uVar9;
  opt.lightmode = false;
  opt._1_3_ = 0;
  opt.num_threads = 0;
  opt.blob_allocator._0_4_ = 0;
  opt.blob_allocator._4_4_ = 0;
  opt.blob_allocator = (Allocator *)0x0;
  opt.workspace_allocator._0_4_ = 4;
  opt.workspace_allocator._4_4_ = 0;
  opt.use_winograd_convolution = true;
  opt.use_sgemm_convolution = false;
  opt.use_int8_inference = false;
  opt.use_vulkan_compute = false;
  opt.use_int8_arithmetic = false;
  opt.use_packing_layout = false;
  opt.use_shader_pack8 = false;
  opt.use_bf16_storage = false;
  opt._36_4_ = 0;
  if ((int)uVar10 != 0) {
    ptr_1 = (void *)0x0;
    iVar6 = posix_memalign(&ptr_1,0x10,uVar10 * 4 + 4);
    if (iVar6 != 0) {
      ptr_1 = (void *)0x0;
    }
    opt._0_8_ = ptr_1;
    opt.blob_allocator = (Allocator *)((long)ptr_1 + uVar10 * 4);
    *(undefined4 *)((long)ptr_1 + uVar10 * 4) = 1;
  }
  if (uVar10 != 0) {
    uVar11 = 0;
    do {
      fVar13 = RandomFloat(-2.0,2.0);
      *(float *)(opt._0_8_ + uVar11 * 4) = fVar13;
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar10);
  }
  pMVar4 = weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)&opt) {
    if (opt.blob_allocator != (Allocator *)0x0) {
      LOCK();
      *(int *)opt.blob_allocator = *(int *)opt.blob_allocator + 1;
      UNLOCK();
    }
    piVar1 = (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if ((weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          if ((weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->data != (void *)0x0) {
            free((weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start)->data);
          }
        }
        else {
          (**(code **)(*(long *)(weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->allocator + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&pMVar4->refcount + 4) = 0;
    *(undefined8 *)((long)&pMVar4->elemsize + 4) = 0;
    pMVar4->data = (void *)0x0;
    pMVar4->refcount = (int *)0x0;
    pMVar4->dims = 0;
    pMVar4->w = 0;
    pMVar4->h = 0;
    pMVar4->c = 0;
    pMVar4->cstep = 0;
    pMVar4->data = (void *)opt._0_8_;
    pMVar4->refcount = (int *)opt.blob_allocator;
    pMVar4->elemsize = CONCAT44(opt.workspace_allocator._4_4_,opt.workspace_allocator._0_4_);
    pMVar4->elempack = CONCAT22(opt._26_2_,opt._24_2_);
    pMVar4->allocator = (Allocator *)opt._32_8_;
    pMVar4->dims = 1;
    pMVar4->w = (int)uVar10;
    pMVar4->h = 1;
    pMVar4->c = 1;
    pMVar4->cstep = uVar10;
  }
  if (opt.blob_allocator != (Allocator *)0x0) {
    LOCK();
    *(int *)opt.blob_allocator = *(int *)opt.blob_allocator + -1;
    UNLOCK();
    if (*(int *)opt.blob_allocator == 0) {
      if (opt._32_8_ == 0) {
        if (opt._0_8_ != 0) {
          free((void *)opt._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)opt._32_8_ + 0x18))();
      }
    }
  }
  opt.lightmode = false;
  opt._1_3_ = 0;
  opt.num_threads = 0;
  opt.blob_allocator._0_4_ = 0;
  opt.blob_allocator._4_4_ = 0;
  opt.blob_allocator = (Allocator *)0x0;
  opt.workspace_allocator._0_4_ = 4;
  opt.workspace_allocator._4_4_ = 0;
  opt.use_winograd_convolution = true;
  opt.use_sgemm_convolution = false;
  opt.use_int8_inference = false;
  opt.use_vulkan_compute = false;
  opt.use_int8_arithmetic = false;
  opt.use_packing_layout = false;
  opt.use_shader_pack8 = false;
  opt.use_bf16_storage = false;
  opt._36_4_ = 0;
  if (outch != 0) {
    ptr_1 = (void *)0x0;
    iVar6 = posix_memalign(&ptr_1,0x10,uVar9 * 4 + 4);
    if (iVar6 != 0) {
      ptr_1 = (void *)0x0;
    }
    opt._0_8_ = ptr_1;
    opt.blob_allocator = (Allocator *)((long)ptr_1 + uVar9 * 4);
    *(undefined4 *)((long)ptr_1 + uVar9 * 4) = 1;
  }
  if (uVar9 != 0) {
    uVar10 = 0;
    do {
      fVar13 = RandomFloat(-2.0,2.0);
      *(float *)(opt._0_8_ + uVar10 * 4) = fVar13;
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar9);
  }
  if (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start + 1 != (pointer)&opt) {
    if (opt.blob_allocator != (Allocator *)0x0) {
      LOCK();
      *(int *)opt.blob_allocator = *(int *)opt.blob_allocator + 1;
      UNLOCK();
    }
    piVar1 = weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start[1].refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
          if (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start[1].data != (void *)0x0) {
            free(weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].data);
          }
        }
        else {
          (**(code **)(*(long *)weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_start[1].allocator + 0x18))();
        }
      }
    }
    *(undefined8 *)
     ((long)&weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start[1].refcount + 4) = 0;
    *(undefined8 *)
     ((long)&weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start[1].elemsize + 4) = 0;
    weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].data = (void *)0x0;
    weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].refcount = (int *)0x0;
    weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].dims = 0;
    weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].w = 0;
    weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].h = 0;
    weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].c = 0;
    weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].cstep = 0;
    weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].data = (void *)opt._0_8_;
    weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].refcount = (int *)opt.blob_allocator;
    weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].elemsize =
         CONCAT44(opt.workspace_allocator._4_4_,opt.workspace_allocator._0_4_);
    weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].elempack = CONCAT22(opt._26_2_,opt._24_2_);
    weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].allocator = (Allocator *)opt._32_8_;
    weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].dims = 1;
    weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].w = outch;
    weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].h = 1;
    weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].c = 1;
    weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].cstep = uVar9;
  }
  if (opt.blob_allocator != (Allocator *)0x0) {
    LOCK();
    *(int *)opt.blob_allocator = *(int *)opt.blob_allocator + -1;
    UNLOCK();
    if (*(int *)opt.blob_allocator == 0) {
      if (opt._32_8_ == 0) {
        if (opt._0_8_ != 0) {
          free((void *)opt._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)opt._32_8_ + 0x18))();
      }
    }
  }
  opt.workspace_allocator._0_4_ = 0;
  opt.workspace_allocator._4_4_ = 0;
  opt.use_winograd_convolution = false;
  opt.use_sgemm_convolution = false;
  opt.use_int8_inference = false;
  opt.use_vulkan_compute = false;
  opt.lightmode = false;
  opt._1_3_ = 0;
  opt.num_threads = 0;
  opt.blob_allocator._0_4_ = 0;
  opt.blob_allocator._4_4_ = 0;
  ncnn::Option::Option(&opt);
  opt.num_threads = 1;
  opt.use_int8_inference = false;
  opt.use_vulkan_compute = true;
  iVar6 = test_layer<ncnn::InnerProduct>
                    ("InnerProduct",&pd,&weights,&opt,a,0.001,(_func_void_InnerProduct_ptr *)0x0);
  if (iVar6 != 0) {
    fprintf(_stderr,
            "test_innerproduct failed a.dims=%d a=(%d %d %d) outch=%d bias=%d act=%d actparams=[%f,%f]\n"
            ,SUB84((double)*local_988.data,0),(double)*(float *)((long)local_988.data + 4),
            (ulong)(uint)a->dims,(ulong)(uint)a->w,(ulong)(uint)a->h,(ulong)(uint)a->c,
            (ulong)(uint)outch,1,(ulong)i);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&weights);
  if (local_988.refcount != (int *)0x0) {
    LOCK();
    *local_988.refcount = *local_988.refcount + -1;
    UNLOCK();
    if (*local_988.refcount == 0) {
      if (local_988.allocator == (Allocator *)0x0) {
        if ((float *)local_988.data != (float *)0x0) {
          free(local_988.data);
        }
      }
      else {
        (**(code **)(*(long *)local_988.allocator + 0x18))();
      }
    }
  }
  local_988.elemsize._0_4_ = 0;
  local_988.elemsize._4_4_ = 0;
  local_988.elempack = 0;
  local_988.data = (void *)0x0;
  local_988.refcount._0_4_ = 0;
  local_988.refcount._4_4_ = 0;
  local_988.dims = 0;
  local_988.w = 0;
  local_988.h = 0;
  local_988.c = 0;
  local_988.cstep = 0;
  lVar8 = 0x8c0;
  do {
    piVar1 = *(int **)((long)&pd.params[0].v.data + lVar8);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&pd.params[0].type + lVar8);
        plVar2 = *(long **)((long)&pd.params[0].v.elempack + lVar8);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&pd.params[0].v.data + lVar8 + 4) = 0;
    *(undefined8 *)((long)&pd.params[0].v.refcount + lVar8 + 4) = 0;
    *(undefined8 *)((long)&pd.params[0].type + lVar8) = 0;
    *(undefined8 *)((long)&pd.params[0].v.data + lVar8) = 0;
    *(undefined8 *)((long)&pd.params[0].v.allocator + lVar8) = 0;
    *(undefined8 *)((long)&pd.params[0].v.dims + lVar8) = 0;
    *(undefined8 *)((long)&pd.params[0].v.h + lVar8) = 0;
    lVar8 = lVar8 + -0x48;
  } while (lVar8 != -0x40);
  return iVar6;
}

Assistant:

static int test_innerproduct(const ncnn::Mat& a, int outch, int bias)
{
    ncnn::ParamDict pd;
    pd.set(0, outch);// num_output
    pd.set(1, bias);// bias_term
    pd.set(2, outch*a.w*a.h*a.c);

    int activation_type = RAND() % 5;// 0 1 2 3 4
    ncnn::Mat activation_params(2);
    activation_params[0] = RandomFloat(-1, 0);// alpha
    activation_params[1] = RandomFloat(0, 1);// beta
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    std::vector<ncnn::Mat> weights(bias ? 2 : 1);
    weights[0] = RandomMat(outch*a.w*a.h*a.c);
    if (bias)
        weights[1] = RandomMat(outch);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::InnerProduct>("InnerProduct", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_innerproduct failed a.dims=%d a=(%d %d %d) outch=%d bias=%d act=%d actparams=[%f,%f]\n", a.dims, a.w, a.h, a.c, outch, bias, activation_type, activation_params[0], activation_params[1]);
    }

    return ret;
}